

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread.cpp
# Opt level: O0

void __thiscall QThread::~QThread(QThread *this)

{
  QThreadPrivate *pQVar1;
  ushort *puVar2;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  QThreadPrivate *d;
  QMutexLocker<QMutex> locker;
  TimerType in_stack_ffffffffffffff68;
  ForeverConstant in_stack_ffffffffffffff6c;
  QDeadlineTimer *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  QThreadPrivate *in_stack_ffffffffffffff80;
  QObject *in_stack_ffffffffffffffa8;
  QMessageLogger local_48;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RDI = &PTR_metaObject_00be8650;
  pQVar1 = d_func((QThread *)0x55642e);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QMutexLocker<QMutex>::QMutexLocker
            ((QMutexLocker<QMutex> *)in_stack_ffffffffffffff70,
             (QMutex *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  if (pQVar1->threadState == Finishing) {
    in_stack_ffffffffffffff80 = pQVar1;
    QDeadlineTimer::QDeadlineTimer
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
    QThreadPrivate::wait(in_stack_ffffffffffffff80,&local_18);
  }
  if ((pQVar1->threadState == Running) && ((pQVar1->data->isAdopted & 1U) == 0)) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
               (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
               (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    QObject::objectName(in_stack_ffffffffffffffa8);
    QtPrivate::asString((QString *)&stack0xffffffffffffffa0);
    puVar2 = QString::utf16((QString *)in_stack_ffffffffffffff70);
    QMessageLogger::fatal
              (&local_48,"QThread: Destroyed while thread \'%ls\' is still running",puVar2);
  }
  QBasicAtomicPointer<QThread>::storeRelease
            ((QBasicAtomicPointer<QThread> *)in_stack_ffffffffffffff70,
             (Type)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)in_stack_ffffffffffffff70);
  QObject::~QObject((QObject *)locker._8_8_);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QThread::~QThread()
{
    Q_D(QThread);
    {
        QMutexLocker locker(&d->mutex);
        if (d->threadState == QThreadPrivate::Finishing)
            d->wait(locker, QDeadlineTimer::Forever);
        if (d->threadState == QThreadPrivate::Running && !d->data->isAdopted)
            qFatal("QThread: Destroyed while thread '%ls' is still running", qUtf16Printable(objectName()));

        d->data->thread.storeRelease(nullptr);
    }
}